

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ssize_t __thiscall
duckdb_parquet::ColumnMetaData::write(ColumnMetaData *this,int __fd,void *__buf,size_t __n)

{
  _ColumnMetaData__isset _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ssize_t sVar17;
  size_t sVar18;
  void *__buf_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  pointer ptVar19;
  pointer pPVar20;
  pointer pbVar21;
  pointer pKVar22;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar2 = (*this_00->_vptr_TProtocol[4])(this_00,"ColumnMetaData");
  iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"type",8,1);
  iVar4 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)this->type);
  iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar6 = (*this_00->_vptr_TProtocol[6])(this_00,"encodings",0xf,2);
  iVar7 = (*this_00->_vptr_TProtocol[0xb])
                    (this_00,8,
                     (ulong)((long)(this->encodings).
                                   super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                                   .
                                   super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->encodings).
                                  super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                                  .
                                  super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2);
  iVar2 = iVar6 + iVar7 + iVar4 + iVar5 + iVar3 + iVar2;
  for (ptVar19 = (this->encodings).
                 super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                 .
                 super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ptVar19 !=
      (this->encodings).
      super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>.
      super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
      ._M_impl.super__Vector_impl_data._M_finish; ptVar19 = ptVar19 + 1) {
    iVar3 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)*ptVar19);
    iVar2 = iVar2 + iVar3;
  }
  iVar3 = (*this_00->_vptr_TProtocol[0xc])(this_00);
  iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar5 = (*this_00->_vptr_TProtocol[6])(this_00,"path_in_schema",0xf,3);
  iVar6 = (*this_00->_vptr_TProtocol[0xb])
                    (this_00,0xb,
                     (ulong)((long)(this->path_in_schema).
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->path_in_schema).
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5);
  iVar6 = iVar4 + iVar5 + iVar3 + iVar2 + iVar6;
  for (pbVar21 = (this->path_in_schema).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar21 !=
      (this->path_in_schema).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar21 = pbVar21 + 1) {
    iVar2 = (*this_00->_vptr_TProtocol[0x15])(this_00,pbVar21);
    iVar6 = iVar6 + iVar2;
  }
  iVar2 = (*this_00->_vptr_TProtocol[0xc])(this_00);
  iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar4 = (*this_00->_vptr_TProtocol[6])(this_00,"codec",8,4);
  iVar5 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)this->codec);
  iVar7 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar8 = (*this_00->_vptr_TProtocol[6])(this_00,"num_values",10,5);
  iVar9 = (*this_00->_vptr_TProtocol[0x13])(this_00,this->num_values);
  iVar10 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar11 = (*this_00->_vptr_TProtocol[6])(this_00,"total_uncompressed_size",10,6);
  iVar12 = (*this_00->_vptr_TProtocol[0x13])(this_00,this->total_uncompressed_size);
  iVar13 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar14 = (*this_00->_vptr_TProtocol[6])(this_00,"total_compressed_size",10,7);
  iVar15 = (*this_00->_vptr_TProtocol[0x13])(this_00,this->total_compressed_size);
  iVar16 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar2 = iVar13 + iVar14 + iVar15 + iVar16 +
          iVar9 + iVar10 + iVar11 + iVar12 + iVar5 + iVar7 + iVar8 + iVar3 + iVar4 + iVar2 + iVar6;
  if (((byte)this->__isset & 1) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"key_value_metadata",0xf,8);
    iVar4 = (*this_00->_vptr_TProtocol[0xb])
                      (this_00,0xc,
                       ((long)(this->key_value_metadata).
                              super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                              .
                              super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->key_value_metadata).
                             super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                             .
                             super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x50 & 0xffffffff);
    iVar4 = iVar3 + iVar2 + iVar4;
    for (pKVar22 = (this->key_value_metadata).
                   super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                   .
                   super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pKVar22 !=
        (this->key_value_metadata).
        super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
        super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
        _M_impl.super__Vector_impl_data._M_finish; pKVar22 = pKVar22 + 1) {
      iVar2 = (**(code **)(*(long *)pKVar22 + 0x18))(pKVar22,this_00);
      iVar4 = iVar4 + iVar2;
    }
    iVar3 = (*this_00->_vptr_TProtocol[0xc])(this_00);
    iVar2 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar3 + iVar4 + iVar2;
  }
  iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"data_page_offset",10,9);
  iVar4 = (*this_00->_vptr_TProtocol[0x13])(this_00,this->data_page_offset);
  iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
  _Var1 = this->__isset;
  if (((byte)_Var1 & 2) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"index_page_offset",10);
    iVar4 = (*this_00->_vptr_TProtocol[0x13])(this_00,this->index_page_offset);
    iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((byte)_Var1 & 4) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"dictionary_page_offset",10,0xb);
    iVar4 = (*this_00->_vptr_TProtocol[0x13])(this_00,this->dictionary_page_offset);
    iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((byte)_Var1 & 8) != 0) {
    sVar18 = 0xc;
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"statistics",0xc);
    sVar17 = Statistics::write(&this->statistics,__fd,__buf_00,sVar18);
    iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = (int)sVar17 + iVar4 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((byte)_Var1 & 0x10) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"encoding_stats",0xf,0xd);
    iVar4 = (*this_00->_vptr_TProtocol[0xb])
                      (this_00,0xc,
                       ((long)(this->encoding_stats).
                              super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
                              .
                              super__Vector_base<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->encoding_stats).
                             super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
                             .
                             super__Vector_base<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18 & 0xffffffff);
    iVar4 = iVar3 + iVar2 + iVar4;
    for (pPVar20 = (this->encoding_stats).
                   super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
                   .
                   super__Vector_base<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pPVar20 !=
        (this->encoding_stats).
        super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
        .
        super__Vector_base<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
        ._M_impl.super__Vector_impl_data._M_finish; pPVar20 = pPVar20 + 1) {
      iVar2 = (**(code **)(*(long *)pPVar20 + 0x18))(pPVar20,this_00);
      iVar4 = iVar4 + iVar2;
    }
    iVar3 = (*this_00->_vptr_TProtocol[0xc])(this_00);
    iVar2 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar3 + iVar4 + iVar2;
    _Var1 = this->__isset;
  }
  if (((byte)_Var1 & 0x20) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"bloom_filter_offset",10,0xe);
    iVar4 = (*this_00->_vptr_TProtocol[0x13])(this_00,this->bloom_filter_offset);
    iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((byte)_Var1 & 0x40) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"bloom_filter_length",8,0xf);
    iVar4 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)(uint)this->bloom_filter_length);
    iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if ((char)_Var1 < '\0') {
    sVar18 = 0x10;
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"size_statistics",0xc);
    sVar17 = SizeStatistics::write(&this->size_statistics,__fd,__buf_01,sVar18);
    iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = (int)sVar17 + iVar4 + iVar3 + iVar2;
  }
  iVar3 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar4 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar3 + iVar2 + iVar4);
}

Assistant:

uint32_t ColumnMetaData::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("ColumnMetaData");

  xfer += oprot->writeFieldBegin("type", ::apache::thrift::protocol::T_I32, 1);
  xfer += oprot->writeI32(static_cast<int32_t>(this->type));
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("encodings", ::apache::thrift::protocol::T_LIST, 2);
  {
    xfer += oprot->writeListBegin(::apache::thrift::protocol::T_I32, static_cast<uint32_t>(this->encodings.size()));
    duckdb::vector<Encoding::type> ::const_iterator _iter120;
    for (_iter120 = this->encodings.begin(); _iter120 != this->encodings.end(); ++_iter120)
    {
      xfer += oprot->writeI32(static_cast<int32_t>((*_iter120)));
    }
    xfer += oprot->writeListEnd();
  }
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("path_in_schema", ::apache::thrift::protocol::T_LIST, 3);
  {
    xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRING, static_cast<uint32_t>(this->path_in_schema.size()));
    duckdb::vector<std::string> ::const_iterator _iter121;
    for (_iter121 = this->path_in_schema.begin(); _iter121 != this->path_in_schema.end(); ++_iter121)
    {
      xfer += oprot->writeString((*_iter121));
    }
    xfer += oprot->writeListEnd();
  }
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("codec", ::apache::thrift::protocol::T_I32, 4);
  xfer += oprot->writeI32(static_cast<int32_t>(this->codec));
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("num_values", ::apache::thrift::protocol::T_I64, 5);
  xfer += oprot->writeI64(this->num_values);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("total_uncompressed_size", ::apache::thrift::protocol::T_I64, 6);
  xfer += oprot->writeI64(this->total_uncompressed_size);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("total_compressed_size", ::apache::thrift::protocol::T_I64, 7);
  xfer += oprot->writeI64(this->total_compressed_size);
  xfer += oprot->writeFieldEnd();

  if (this->__isset.key_value_metadata) {
    xfer += oprot->writeFieldBegin("key_value_metadata", ::apache::thrift::protocol::T_LIST, 8);
    {
      xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRUCT, static_cast<uint32_t>(this->key_value_metadata.size()));
      duckdb::vector<KeyValue> ::const_iterator _iter122;
      for (_iter122 = this->key_value_metadata.begin(); _iter122 != this->key_value_metadata.end(); ++_iter122)
      {
        xfer += (*_iter122).write(oprot);
      }
      xfer += oprot->writeListEnd();
    }
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldBegin("data_page_offset", ::apache::thrift::protocol::T_I64, 9);
  xfer += oprot->writeI64(this->data_page_offset);
  xfer += oprot->writeFieldEnd();

  if (this->__isset.index_page_offset) {
    xfer += oprot->writeFieldBegin("index_page_offset", ::apache::thrift::protocol::T_I64, 10);
    xfer += oprot->writeI64(this->index_page_offset);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.dictionary_page_offset) {
    xfer += oprot->writeFieldBegin("dictionary_page_offset", ::apache::thrift::protocol::T_I64, 11);
    xfer += oprot->writeI64(this->dictionary_page_offset);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.statistics) {
    xfer += oprot->writeFieldBegin("statistics", ::apache::thrift::protocol::T_STRUCT, 12);
    xfer += this->statistics.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.encoding_stats) {
    xfer += oprot->writeFieldBegin("encoding_stats", ::apache::thrift::protocol::T_LIST, 13);
    {
      xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRUCT, static_cast<uint32_t>(this->encoding_stats.size()));
      duckdb::vector<PageEncodingStats> ::const_iterator _iter123;
      for (_iter123 = this->encoding_stats.begin(); _iter123 != this->encoding_stats.end(); ++_iter123)
      {
        xfer += (*_iter123).write(oprot);
      }
      xfer += oprot->writeListEnd();
    }
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.bloom_filter_offset) {
    xfer += oprot->writeFieldBegin("bloom_filter_offset", ::apache::thrift::protocol::T_I64, 14);
    xfer += oprot->writeI64(this->bloom_filter_offset);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.bloom_filter_length) {
    xfer += oprot->writeFieldBegin("bloom_filter_length", ::apache::thrift::protocol::T_I32, 15);
    xfer += oprot->writeI32(this->bloom_filter_length);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.size_statistics) {
    xfer += oprot->writeFieldBegin("size_statistics", ::apache::thrift::protocol::T_STRUCT, 16);
    xfer += this->size_statistics.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}